

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O1

void close_cb(uv_handle_t *handle)

{
  close_cb_called = close_cb_called + 1;
  return;
}

Assistant:

static void close_cb(uv_fs_t* req) {
  int r;
  ASSERT_PTR_EQ(req, &close_req);
  ASSERT_EQ(req->fs_type, UV_FS_CLOSE);
  ASSERT_OK(req->result);
  close_cb_count++;
  uv_fs_req_cleanup(req);
  if (close_cb_count == 3) {
    r = uv_fs_unlink(loop, &unlink_req, "test_file2", unlink_cb);
    ASSERT_OK(r);
  }
}